

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_show.cpp
# Opt level: O3

unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true> __thiscall
duckdb::Transformer::TransformShowStmt(Transformer *this,PGVariableShowStmt *stmt)

{
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var1;
  Transformer *in_RAX;
  Transformer *pTVar2;
  pointer pSVar3;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_28;
  
  local_28._M_head_impl = (QueryNode *)in_RAX;
  pTVar2 = (Transformer *)operator_new(0x80);
  *(undefined1 *)&pTVar2->options = 1;
  pTVar2->prepared_statement_parameter_index = 0;
  (pTVar2->named_param_map)._M_h._M_buckets = (__buckets_ptr)0x0;
  (pTVar2->named_param_map)._M_h._M_bucket_count = (size_type)&pTVar2->last_param_type;
  (pTVar2->named_param_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x1;
  (pTVar2->named_param_map)._M_h._M_element_count = 0;
  *(undefined8 *)&(pTVar2->named_param_map)._M_h._M_rehash_policy = 0;
  *(undefined4 *)&(pTVar2->named_param_map)._M_h._M_rehash_policy._M_next_resize = 0x3f800000;
  (pTVar2->named_param_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined8 *)&pTVar2->last_param_type = 0;
  (pTVar2->window_clauses)._M_h._M_buckets = &(pTVar2->window_clauses)._M_h._M_before_begin._M_nxt;
  (pTVar2->window_clauses)._M_h._M_bucket_count = 0;
  *(undefined1 *)&(pTVar2->window_clauses)._M_h._M_before_begin._M_nxt = 0;
  (pTVar2->parent).ptr = (Transformer *)&PTR__SelectStatement_02442ad0;
  *(undefined8 *)&(pTVar2->window_clauses)._M_h._M_rehash_policy = 0;
  (this->parent).ptr = pTVar2;
  TransformShow((Transformer *)&stack0xffffffffffffffd8,stmt);
  pSVar3 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>::
           operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                       *)this);
  _Var1._M_head_impl =
       (pSVar3->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
       _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
       super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
  (pSVar3->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
  super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = local_28._M_head_impl;
  if (_Var1._M_head_impl != (QueryNode *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_QueryNode + 8))();
  }
  return (unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>)
         (unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>)this;
}

Assistant:

unique_ptr<SelectStatement> Transformer::TransformShowStmt(duckdb_libpgquery::PGVariableShowStmt &stmt) {
	auto result = make_uniq<SelectStatement>();
	result->node = TransformShow(stmt);
	return result;
}